

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageImage::verify
          (RenderVertexStorageImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  long lVar1;
  int iVar2;
  ChannelType y;
  ChannelOrder x;
  int pos;
  uint uVar3;
  UVec4 pixel;
  IVec3 size;
  undefined1 local_88 [16];
  undefined1 local_78 [20];
  Vector<int,_3> local_64;
  PixelBufferAccess local_58;
  
  uVar3 = 0;
  while( true ) {
    lVar1 = *(long *)ctx;
    iVar2 = *(int *)(lVar1 + 0x50) * *(int *)(lVar1 + 0x54) * 2;
    if (iVar2 <= (int)uVar3) break;
    tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(lVar1 + 0x48));
    tcu::Vector<int,_3>::Vector(&local_64,&local_58.super_ConstPixelBufferAccess.m_size);
    tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(*(long *)ctx + 0x48));
    tcu::ConstPixelBufferAccess::getPixelUint
              ((ConstPixelBufferAccess *)local_88,(int)&local_58,
               (int)((long)(ulong)(uVar3 >> 1) / (long)local_64.m_data[0]),
               (int)((long)(ulong)(uVar3 >> 1) % (long)local_64.m_data[0]));
    if ((uVar3 & 1) == 0) {
      tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
      x = local_88._0_4_;
      y = local_88._4_4_;
    }
    else {
      tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
      x = local_88._8_4_;
      y = local_88._12_4_;
    }
    local_78._8_8_ = &DAT_3f8000003f800000;
    local_78._0_8_ = &DAT_3f8000003f800000;
    tcu::PixelBufferAccess::setPixel(&local_58,(Vec4 *)local_78,x,y,0);
    uVar3 = uVar3 + 1;
  }
  return iVar2;
}

Assistant:

void RenderVertexStorageImage::verify (VerifyRenderPassContext& context, size_t)
{
	for (int pos = 0; pos < (int)(context.getReferenceImage().getWidth() * context.getReferenceImage().getHeight() * 2); pos++)
	{
		const tcu::IVec3		size	= context.getReferenceImage().getAccess().getSize();
		const tcu::UVec4		pixel	= context.getReferenceImage().getAccess().getPixelUint((pos / 2) / size.x(), (pos / 2) % size.x());

		if (pos % 2 == 0)
			context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), pixel.x(), pixel.y());
		else
			context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), pixel.z(), pixel.w());
	}
}